

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O1

bool __thiscall
clickhouse::CodedInputStream::ReadRaw(CodedInputStream *this,void *buffer,size_t size)

{
  int iVar1;
  undefined4 extraout_var;
  void *ptr;
  void *local_30;
  size_t __n;
  
  if (size != 0) {
    do {
      iVar1 = (*(this->input_->super_InputStream)._vptr_InputStream[3])(this->input_,&local_30,size)
      ;
      __n = CONCAT44(extraout_var,iVar1);
      memcpy(buffer,local_30,__n);
      buffer = (void *)((long)buffer + __n);
      size = size - __n;
    } while (size != 0);
  }
  return true;
}

Assistant:

bool CodedInputStream::ReadRaw(void* buffer, size_t size) {
    uint8_t* p = static_cast<uint8_t*>(buffer);

    while (size > 0) {
        const void* ptr;
        size_t len = input_->Next(&ptr, size);

        memcpy(p, ptr, len);

        p += len;
        size -= len;
    }

    return true;
}